

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpyfldin_s.c
# Opt level: O1

errno_t strcpyfldin_s(char *dest,rsize_t dmax,char *src,rsize_t slen)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  size_t __n;
  errno_t error;
  errno_t eVar4;
  char *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar5 = "strcpyfldin_s: dest is null";
LAB_00104ccc:
    eVar4 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    pcVar5 = "strcpyfldin_s: dmax is 0";
LAB_00104ce1:
    eVar4 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      if (src == (char *)0x0) {
        memset(dest,0,dmax);
        pcVar5 = "strcpyfldin_s: src is null";
        goto LAB_00104ccc;
      }
      if (slen == 0) {
        memset(dest,0,dmax);
        pcVar5 = "strcpyfldin_s: slen is 0";
        goto LAB_00104ce1;
      }
      if (slen <= dmax) {
        __n = dmax;
        pcVar5 = dest;
        if (dest < src) {
          lVar6 = 0;
          do {
            pcVar5 = dest + lVar6;
            pcVar1 = src + lVar6;
            if (*pcVar1 == '\0') goto LAB_00104dd6;
            if (pcVar5 == src) goto LAB_00104db1;
            lVar6 = lVar6 + 1;
            *pcVar5 = *pcVar1;
            __n = __n - 1;
          } while (__n != 0);
          __n = 0;
          pcVar5 = dest + lVar6;
        }
        else {
          do {
            cVar2 = *src;
            if (cVar2 == '\0') goto LAB_00104dd6;
            if (src == dest) goto LAB_00104db1;
            src = src + 1;
            pcVar1 = pcVar5 + 1;
            *pcVar5 = cVar2;
            __n = __n - 1;
            pcVar5 = pcVar1;
          } while (__n != 0);
          __n = 0;
        }
LAB_00104dd6:
        eVar4 = 0;
        if (__n != 0) {
          memset(pcVar5,0,__n);
        }
        goto LAB_00104cf2;
      }
      memset(dest,0,dmax);
      pcVar5 = "strcpyfldin_s: slen exceeds max";
    }
    else {
      pcVar5 = "strcpyfldin_s: dmax exceeds max";
    }
    eVar4 = 0x193;
    error = 0x193;
  }
  goto LAB_00104ced;
LAB_00104db1:
  memset(dest,0,dmax);
  pcVar5 = "strcpyfldin_s: overlapping objects";
  eVar4 = 0x194;
  error = 0x194;
LAB_00104ced:
  invoke_safe_str_constraint_handler(pcVar5,(void *)0x0,error);
LAB_00104cf2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return eVar4;
}

Assistant:

errno_t
strcpyfldin_s (char *dest, rsize_t dmax, const char *src, rsize_t slen)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    if (src == NULL) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (slen == 0) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (slen > dmax) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }


    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0 && *src) {

            if (dest == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0 && *src) {

            if (src == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }
    }

    /*
     * finish filling in the field with nulls if there is slack space
     */
    while (dmax) { *dest = '\0'; dmax--; dest++; }

    return (EOK);
}